

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
TypeClass::TypeClass
          (TypeClass *this,Allocator *allocator,SynIdentifier *identifier,SynBase *source,
          ScopeData *scope,TypeGenericClassProto *proto,IntrusiveList<MatchData> generics,
          bool extendable,TypeClass *baseClass)

{
  bool extendable_local;
  TypeGenericClassProto *proto_local;
  ScopeData *scope_local;
  SynBase *source_local;
  SynIdentifier *identifier_local;
  Allocator *allocator_local;
  TypeClass *this_local;
  
  TypeStruct::TypeStruct(&this->super_TypeStruct,0x18,identifier->name);
  (this->super_TypeStruct).super_TypeBase._vptr_TypeBase = (_func_int **)&PTR__TypeClass_003084f8;
  SynIdentifier::SynIdentifier(&this->identifier,identifier);
  this->source = source;
  this->scope = scope;
  this->proto = proto;
  (this->generics).head = generics.head;
  (this->generics).tail = generics.tail;
  IntrusiveList<MatchData>::IntrusiveList(&this->aliases);
  this->extendable = extendable;
  this->baseClass = baseClass;
  SmallArray<FunctionData_*,_4U>::SmallArray(&this->methods,allocator);
  DirectChainedMap<FunctionData_*>::DirectChainedMap(&this->methodMap,allocator);
  this->completed = false;
  this->isInternal = false;
  this->hasFinalizer = false;
  this->defaultAssign = (FunctionData *)0x0;
  return;
}

Assistant:

TypeClass(Allocator *allocator, const SynIdentifier& identifier, SynBase *source, ScopeData *scope, TypeGenericClassProto *proto, IntrusiveList<MatchData> generics, bool extendable, TypeClass *baseClass): TypeStruct(myTypeID, identifier.name), identifier(identifier), source(source), scope(scope), proto(proto), generics(generics), extendable(extendable), baseClass(baseClass), methods(allocator), methodMap(allocator)
	{
		completed = false;
		isInternal = false;

		hasFinalizer = false;

		defaultAssign = NULL;
	}